

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::InternReadFile_3DGS_MDL7(MDLImporter *this)

{
  _Bit_pointer *this_00;
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  ai_uint32 aVar4;
  ulong uVar5;
  ulong *puVar6;
  void *pvVar7;
  Logger *pLVar8;
  size_type sVar9;
  aiMaterial *paVar10;
  reference ppaVar11;
  aiNode *paVar12;
  aiMesh **ppaVar13;
  reference ppaVar14;
  aiNode **ppaVar15;
  uint *puVar16;
  char *__s;
  size_t sVar17;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *this_01;
  aiNode *this_02;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *pvVar18;
  reference rVar19;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *local_668;
  aiNode *pc;
  aiNode *pcOldRoot;
  size_t maxSize;
  char *szBuffer;
  uint a_1;
  aiNode *pcNode;
  uint32_t i_5;
  uint a;
  uint32_t i_4;
  uint q;
  uint p;
  uint32_t i_3;
  _Bit_type local_5e8;
  uint local_5dc;
  uint qq;
  aiVector3t<float> local_5cc;
  value_type_conflict3 local_5c0;
  uint local_5bc;
  undefined1 local_5b8 [4];
  uint iNumVertices;
  IntGroupData_MDL7 groupData;
  IntSplitGroupData_MDL7 splitGroupData;
  int i_2;
  int i_1;
  aiString szName;
  aiColor3D clr;
  aiMaterial *pcHelper;
  int local_dc;
  uint local_d8;
  int iMode;
  uint iSkin;
  uint ofs;
  IntGroupInfo_MDL7 groupInfo;
  uint iGroup;
  char *aszGroupNameBuffer;
  size_t buffersize;
  uint32_t i;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> *avOutList;
  Header_MDL7 *local_70;
  uchar *szCurrent;
  Header_MDL7 *pcHeader;
  IntSharedData_MDL7 sharedData;
  MDLImporter *this_local;
  
  sharedData._72_8_ = this;
  if (this->pScene != (aiScene *)0x0) {
    MDL::IntSharedData_MDL7::IntSharedData_MDL7((IntSharedData_MDL7 *)&pcHeader);
    szCurrent = this->mBuffer;
    local_70 = (Header_MDL7 *)((long)szCurrent + 0x30);
    ValidateHeader_3DGS_MDL7(this,(Header_MDL7 *)szCurrent);
    local_70 = (Header_MDL7 *)
               (local_70->ident + *(int *)(szCurrent + 8) * (uint)*(ushort *)(szCurrent + 0x1c));
    sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)LoadBones_3DGS_MDL7(this);
    uVar5 = (ulong)*(uint *)(szCurrent + 0xc);
    puVar6 = (ulong *)operator_new__(uVar5 * 0x18 + 8);
    *puVar6 = uVar5;
    pvVar18 = (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)(puVar6 + 1);
    if (uVar5 != 0) {
      local_668 = pvVar18;
      do {
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector(local_668);
        local_668 = local_668 + 1;
      } while (local_668 != pvVar18 + uVar5);
    }
    for (buffersize._4_4_ = 0; buffersize._4_4_ < *(uint *)(szCurrent + 0xc);
        buffersize._4_4_ = buffersize._4_4_ + 1) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(pvVar18 + buffersize._4_4_,3);
    }
    iVar1 = *(int *)(szCurrent + 0xc);
    pvVar7 = operator_new__((ulong)(uint)(iVar1 << 4));
    for (groupInfo.pcGroupVerts._4_4_ = 0; groupInfo.pcGroupVerts._4_4_ < *(uint *)(szCurrent + 0xc)
        ; groupInfo.pcGroupVerts._4_4_ = groupInfo.pcGroupVerts._4_4_ + 1) {
      MDL::IntGroupInfo_MDL7::IntGroupInfo_MDL7
                ((IntGroupInfo_MDL7 *)&iSkin,(Group_MDL7 *)local_70,groupInfo.pcGroupVerts._4_4_);
      local_70 = (Header_MDL7 *)(groupInfo._0_8_ + 0x2c);
      SizeCheck(this,local_70,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x577);
      if (*(char *)groupInfo._0_8_ != '\x01') {
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,"[3DGS MDL7] Not a triangle mesh group. Continuing happily");
      }
      iMode = groupInfo.pcGroupVerts._4_4_ * 0x10;
      uVar2 = *(undefined8 *)(groupInfo._0_8_ + 0x10);
      *(undefined8 *)((long)pvVar7 + (ulong)(uint)iMode) = *(undefined8 *)(groupInfo._0_8_ + 8);
      ((undefined8 *)((long)pvVar7 + (ulong)(uint)iMode))[1] = uVar2;
      *(undefined1 *)((long)pvVar7 + (ulong)(iMode + 0xf)) = 0;
      this_00 = &sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage;
      sVar9 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                        ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_00);
      std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve
                ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)this_00,
                 sVar9 + (long)*(int *)(groupInfo._0_8_ + 0x18));
      sVar9 = std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)&pcHeader);
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)&pcHeader,
                 sVar9 + (long)*(int *)(groupInfo._0_8_ + 0x18),false);
      for (local_d8 = 0; local_d8 < *(uint *)(groupInfo._0_8_ + 0x18); local_d8 = local_d8 + 1) {
        ParseSkinLump_3DGS_MDL7
                  (this,(uchar *)local_70,(uchar **)&local_70,
                   (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                   &sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage);
      }
      bVar3 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::empty
                        ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                         &sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage);
      if (bVar3) {
        local_dc = 2;
        paVar10 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(paVar10);
        pcHelper = paVar10;
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                  ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                   &sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,&pcHelper);
        ppaVar11 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                             ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                              &sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>
                               ._M_impl.super__Bvector_impl_data._M_end_of_storage,0);
        paVar10 = *ppaVar11;
        aiMaterial::AddProperty<int>(paVar10,&local_dc,1,"$mat.shadingm",0,0);
        aiColor3D::aiColor3D((aiColor3D *)(szName.data + 0x3f8));
        szName.data[0x3f8] = -0x66;
        szName.data[0x3f9] = -0x67;
        szName.data[0x3fa] = '\x19';
        szName.data[0x3fb] = '?';
        szName.data[0x3fc] = -0x66;
        szName.data[0x3fd] = -0x67;
        szName.data[0x3fe] = '\x19';
        szName.data[0x3ff] = '?';
        aiMaterial::AddProperty<aiColor3D>
                  (paVar10,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.diffuse",0,0);
        aiMaterial::AddProperty<aiColor3D>
                  (paVar10,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.specular",0,0);
        szName.data[0x3f8] = -0x33;
        szName.data[0x3f9] = -0x34;
        szName.data[0x3fa] = 'L';
        szName.data[0x3fb] = '=';
        szName.data[0x3fc] = -0x33;
        szName.data[0x3fd] = -0x34;
        szName.data[0x3fe] = 'L';
        szName.data[0x3ff] = '=';
        aiMaterial::AddProperty<aiColor3D>
                  (paVar10,(aiColor3D *)(szName.data + 0x3f8),1,"$clr.ambient",0,0);
        aiString::aiString((aiString *)&i_2);
        aiString::Set((aiString *)&i_2,"DefaultMaterial");
        aiMaterial::AddProperty(paVar10,(aiString *)&i_2,"?mat.name",0,0);
        std::vector<bool,_std::allocator<bool>_>::resize
                  ((vector<bool,_std::allocator<bool>_> *)&pcHeader,1,false);
      }
      groupInfo.pcGroup = (Group_MDL7 *)local_70;
      for (splitGroupData.avOutList._4_4_ = 0;
          splitGroupData.avOutList._4_4_ < *(int *)(groupInfo._0_8_ + 0x1c);
          splitGroupData.avOutList._4_4_ = splitGroupData.avOutList._4_4_ + 1) {
      }
      groupInfo.pcGroupUVs =
           (TexCoord_MDL7 *)
           (local_70->ident +
           (int)((uint)*(ushort *)(szCurrent + 0x24) * *(int *)(groupInfo._0_8_ + 0x1c)));
      groupInfo.pcGroupTris =
           (Triangle_MDL7 *)
           ((long)&(groupInfo.pcGroupUVs)->u +
           (long)(int)((uint)*(ushort *)(szCurrent + 0x26) * *(int *)(groupInfo._0_8_ + 0x20)));
      for (splitGroupData.avOutList._0_4_ = 0;
          (int)splitGroupData.avOutList < *(int *)(groupInfo._0_8_ + 0x24);
          splitGroupData.avOutList._0_4_ = (int)splitGroupData.avOutList + 1) {
      }
      local_70 = (Header_MDL7 *)
                 ((long)(groupInfo.pcGroupTris)->v_index +
                 (long)(int)((uint)*(ushort *)(szCurrent + 0x28) * *(int *)(groupInfo._0_8_ + 0x24))
                 );
      SizeCheck(this,local_70,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x5c2);
      MDL::IntSplitGroupData_MDL7::IntSplitGroupData_MDL7
                ((IntSplitGroupData_MDL7 *)&groupData.bNeed2UV,(IntSharedData_MDL7 *)&pcHeader,
                 pvVar18 + groupInfo.pcGroupVerts._4_4_);
      MDL::IntGroupData_MDL7::IntGroupData_MDL7((IntGroupData_MDL7 *)local_5b8);
      if ((*(int *)(groupInfo._0_8_ + 0x20) == 0) || (*(int *)(groupInfo._0_8_ + 0x24) == 0)) {
        pLVar8 = DefaultLogger::get();
        Logger::warn(pLVar8,
                     "[3DGS MDL7] Mesh group consists of 0 vertices or faces. It will be skipped.");
      }
      else {
        local_5bc = *(int *)(groupInfo._0_8_ + 0x20) * 3;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &groupData.pcFaces.
                    super__Vector_base<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_5bc);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &groupData.vPositions.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_5bc);
        if (sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          local_5c0 = 0xffffffff;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &groupData.vNormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_5bc,&local_5c0)
          ;
        }
        if (*(int *)(groupInfo._0_8_ + 0x1c) != 0) {
          uVar5 = (ulong)local_5bc;
          aiVector3t<float>::aiVector3t(&local_5cc);
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     &groupData.aiBones.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,uVar5,&local_5cc);
          if (0x19 < *(ushort *)(szCurrent + 0x26)) {
            uVar5 = (ulong)local_5bc;
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)&stack0xfffffffffffffa28);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &groupData.vTextureCoords1.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,uVar5,
                       (aiVector3t<float> *)&stack0xfffffffffffffa28);
            groupData.vTextureCoords2.
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
          }
        }
        std::vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_>::resize
                  ((vector<Assimp::MDL::IntFace_MDL7,_std::allocator<Assimp::MDL::IntFace_MDL7>_> *)
                   local_5b8,(long)*(int *)(groupInfo._0_8_ + 0x20));
        ReadFaces_3DGS_MDL7(this,(IntGroupInfo_MDL7 *)&iSkin,(IntGroupData_MDL7 *)local_5b8);
        SortByMaterials_3DGS_MDL7
                  (this,(IntGroupInfo_MDL7 *)&iSkin,(IntGroupData_MDL7 *)local_5b8,
                   (IntSplitGroupData_MDL7 *)&groupData.bNeed2UV);
        local_5dc = 0;
        while( true ) {
          uVar5 = (ulong)local_5dc;
          sVar9 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                            ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)
                             &sharedData.abNeedMaterials.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_end_of_storage);
          if (sVar9 <= uVar5) break;
          bVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                              (groupData._144_8_ + (ulong)local_5dc * 8));
          if (!bVar3) {
            rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&pcHeader,(ulong)local_5dc);
            _p = rVar19;
            std::_Bit_reference::operator=((_Bit_reference *)&p,true);
          }
          local_5dc = local_5dc + 1;
        }
      }
      ProcessFrames_3DGS_MDL7
                (this,(IntGroupInfo_MDL7 *)&iSkin,(IntGroupData_MDL7 *)local_5b8,
                 (IntSharedData_MDL7 *)&pcHeader,(uchar *)local_70,(uchar **)&local_70);
      GenerateOutputMeshes_3DGS_MDL7
                (this,(IntGroupData_MDL7 *)local_5b8,(IntSplitGroupData_MDL7 *)&groupData.bNeed2UV);
      MDL::IntGroupData_MDL7::~IntGroupData_MDL7((IntGroupData_MDL7 *)local_5b8);
      MDL::IntSplitGroupData_MDL7::~IntSplitGroupData_MDL7
                ((IntSplitGroupData_MDL7 *)&groupData.bNeed2UV);
    }
    paVar12 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar12);
    this->pScene->mRootNode = paVar12;
    for (q = 0; q < *(uint *)(szCurrent + 0xc); q = q + 1) {
      sVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pvVar18 + q);
      this->pScene->mNumMeshes = (int)sVar9 + this->pScene->mNumMeshes;
    }
    ppaVar13 = (aiMesh **)operator_new__((ulong)this->pScene->mNumMeshes << 3);
    this->pScene->mMeshes = ppaVar13;
    i_4 = 0;
    a = 0;
    for (i_5 = 0; i_5 < *(uint *)(szCurrent + 0xc); i_5 = i_5 + 1) {
      pcNode._4_4_ = 0;
      while( true ) {
        sVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pvVar18 + i_5);
        if (sVar9 <= pcNode._4_4_) break;
        ppaVar14 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                             (pvVar18 + i_5,(ulong)pcNode._4_4_);
        this->pScene->mMeshes[i_4] = *ppaVar14;
        pcNode._4_4_ = pcNode._4_4_ + 1;
        i_4 = i_4 + 1;
      }
      bVar3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty(pvVar18 + i_5);
      if (!bVar3) {
        paVar12 = this->pScene->mRootNode;
        paVar12->mNumChildren = paVar12->mNumChildren + 1;
      }
    }
    if (sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      paVar12 = this->pScene->mRootNode;
      paVar12->mNumChildren = paVar12->mNumChildren + 1;
    }
    ppaVar15 = (aiNode **)operator_new__((ulong)this->pScene->mRootNode->mNumChildren << 3);
    this->pScene->mRootNode->mChildren = ppaVar15;
    i_4 = 0;
    for (pcNode._0_4_ = 0; (uint)pcNode < *(uint *)(szCurrent + 0xc);
        pcNode._0_4_ = (uint)pcNode + 1) {
      bVar3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty(pvVar18 + (uint)pcNode);
      if (!bVar3) {
        paVar12 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar12);
        this->pScene->mRootNode->mChildren[i_4] = paVar12;
        sVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pvVar18 + (uint)pcNode);
        paVar12->mNumMeshes = (uint)sVar9;
        puVar16 = (uint *)operator_new__((ulong)paVar12->mNumMeshes << 2);
        paVar12->mMeshes = puVar16;
        paVar12->mParent = this->pScene->mRootNode;
        for (szBuffer._4_4_ = 0; szBuffer._4_4_ < paVar12->mNumMeshes;
            szBuffer._4_4_ = szBuffer._4_4_ + 1) {
          paVar12->mMeshes[szBuffer._4_4_] = a + szBuffer._4_4_;
        }
        sVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(pvVar18 + (uint)pcNode);
        a = (int)sVar9 + a;
        __s = (char *)((long)pvVar7 + (ulong)((uint)pcNode << 4));
        if (*__s == '\0') {
          aVar4 = snprintf(__s,(ulong)(uint)(iVar1 << 4) - (ulong)((uint)pcNode << 4),"Group_%u",
                           (ulong)i_4);
          (paVar12->mName).length = aVar4;
        }
        else {
          sVar17 = strlen(__s);
          (paVar12->mName).length = (ai_uint32)sVar17;
        }
        strncpy((paVar12->mName).data,__s,0x3ff);
        i_4 = i_4 + 1;
      }
    }
    if ((this->pScene->mRootNode->mNumChildren == 1) &&
       (sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) {
      paVar12 = this->pScene->mRootNode;
      this->pScene->mRootNode = *paVar12->mChildren;
      *paVar12->mChildren = (aiNode *)0x0;
      if (paVar12 != (aiNode *)0x0) {
        aiNode::~aiNode(paVar12);
        operator_delete(paVar12);
      }
      this->pScene->mRootNode->mParent = (aiNode *)0x0;
    }
    else {
      aiString::Set(&this->pScene->mRootNode->mName,"<mesh_root>");
    }
    if (pvVar18 != (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)0x0) {
      this_01 = pvVar18 + *puVar6;
      while (pvVar18 != this_01) {
        this_01 = this_01 + -1;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector(this_01);
      }
      operator_delete__(puVar6);
    }
    if (pvVar7 != (void *)0x0) {
      operator_delete__(pvVar7);
    }
    CopyMaterials_3DGS_MDL7(this,(IntSharedData_MDL7 *)&pcHeader);
    HandleMaterialReferences_3DGS_MDL7(this);
    if (sharedData.pcMats.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      this_02 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_02);
      paVar12 = this->pScene->mRootNode;
      paVar12->mChildren[paVar12->mNumChildren - 1] = this_02;
      aiString::Set((aiString *)this_02,"<skeleton_root>");
      AddBonesToNodeGraph_3DGS_MDL7
                (this,(IntBone_MDL7 **)
                      sharedData.pcMats.
                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,this_02,0xffff);
      BuildOutputAnims_3DGS_MDL7
                (this,(IntBone_MDL7 **)
                      sharedData.pcMats.
                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
    MDL::IntSharedData_MDL7::~IntSharedData_MDL7((IntSharedData_MDL7 *)&pcHeader);
    return;
  }
  __assert_fail("__null != pScene",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                ,0x543,"void Assimp::MDLImporter::InternReadFile_3DGS_MDL7()");
}

Assistant:

void MDLImporter::InternReadFile_3DGS_MDL7( )
{
    ai_assert(NULL != pScene);

    MDL::IntSharedData_MDL7 sharedData;

    // current cursor position in the file
    BE_NCONST MDL::Header_MDL7 *pcHeader = (BE_NCONST MDL::Header_MDL7*)this->mBuffer;
    const unsigned char* szCurrent = (const unsigned char*)(pcHeader+1);

    AI_SWAP4(pcHeader->version);
    AI_SWAP4(pcHeader->bones_num);
    AI_SWAP4(pcHeader->groups_num);
    AI_SWAP4(pcHeader->data_size);
    AI_SWAP4(pcHeader->entlump_size);
    AI_SWAP4(pcHeader->medlump_size);
    AI_SWAP2(pcHeader->bone_stc_size);
    AI_SWAP2(pcHeader->skin_stc_size);
    AI_SWAP2(pcHeader->colorvalue_stc_size);
    AI_SWAP2(pcHeader->material_stc_size);
    AI_SWAP2(pcHeader->skinpoint_stc_size);
    AI_SWAP2(pcHeader->triangle_stc_size);
    AI_SWAP2(pcHeader->mainvertex_stc_size);
    AI_SWAP2(pcHeader->framevertex_stc_size);
    AI_SWAP2(pcHeader->bonetrans_stc_size);
    AI_SWAP2(pcHeader->frame_stc_size);

    // validate the header of the file. There are some structure
    // sizes that are expected by the loader to be constant
    this->ValidateHeader_3DGS_MDL7(pcHeader);

    // load all bones (they are shared by all groups, so
    // we'll need to add them to all groups/meshes later)
    // apcBonesOut is a list of all bones or NULL if they could not been loaded
    szCurrent += pcHeader->bones_num * pcHeader->bone_stc_size;
    sharedData.apcOutBones = this->LoadBones_3DGS_MDL7();

    // vector to held all created meshes
    std::vector<aiMesh*>* avOutList;

    // 3 meshes per group - that should be OK for most models
    avOutList = new std::vector<aiMesh*>[pcHeader->groups_num];
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        avOutList[i].reserve(3);

    // buffer to held the names of all groups in the file
	const size_t buffersize( AI_MDL7_MAX_GROUPNAMESIZE*pcHeader->groups_num );
	char* aszGroupNameBuffer = new char[ buffersize ];

    // read all groups
    for (unsigned int iGroup = 0; iGroup < (unsigned int)pcHeader->groups_num;++iGroup) {
        MDL::IntGroupInfo_MDL7 groupInfo((BE_NCONST MDL::Group_MDL7*)szCurrent,iGroup);
        szCurrent = (const unsigned char*)(groupInfo.pcGroup+1);

        VALIDATE_FILE_SIZE(szCurrent);

        AI_SWAP4(groupInfo.pcGroup->groupdata_size);
        AI_SWAP4(groupInfo.pcGroup->numskins);
        AI_SWAP4(groupInfo.pcGroup->num_stpts);
        AI_SWAP4(groupInfo.pcGroup->numtris);
        AI_SWAP4(groupInfo.pcGroup->numverts);
        AI_SWAP4(groupInfo.pcGroup->numframes);

        if (1 != groupInfo.pcGroup->typ)    {
            // Not a triangle-based mesh
            ASSIMP_LOG_WARN("[3DGS MDL7] Not a triangle mesh group. Continuing happily");
        }

        // store the name of the group
        const unsigned int ofs = iGroup*AI_MDL7_MAX_GROUPNAMESIZE;
        ::memcpy(&aszGroupNameBuffer[ofs],
            groupInfo.pcGroup->name,AI_MDL7_MAX_GROUPNAMESIZE);

        // make sure '\0' is at the end
        aszGroupNameBuffer[ofs+AI_MDL7_MAX_GROUPNAMESIZE-1] = '\0';

        // read all skins
        sharedData.pcMats.reserve(sharedData.pcMats.size() + groupInfo.pcGroup->numskins);
        sharedData.abNeedMaterials.resize(sharedData.abNeedMaterials.size() +
            groupInfo.pcGroup->numskins,false);

        for (unsigned int iSkin = 0; iSkin < (unsigned int)groupInfo.pcGroup->numskins;++iSkin) {
            ParseSkinLump_3DGS_MDL7(szCurrent,&szCurrent,sharedData.pcMats);
        }
        // if we have absolutely no skin loaded we need to generate a default material
        if (sharedData.pcMats.empty())  {
            const int iMode = (int)aiShadingMode_Gouraud;
            sharedData.pcMats.push_back(new aiMaterial());
            aiMaterial* pcHelper = (aiMaterial*)sharedData.pcMats[0];
            pcHelper->AddProperty<int>(&iMode, 1, AI_MATKEY_SHADING_MODEL);

            aiColor3D clr;
            clr.b = clr.g = clr.r = 0.6f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_DIFFUSE);
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_SPECULAR);

            clr.b = clr.g = clr.r = 0.05f;
            pcHelper->AddProperty<aiColor3D>(&clr, 1,AI_MATKEY_COLOR_AMBIENT);

            aiString szName;
            szName.Set(AI_DEFAULT_MATERIAL_NAME);
            pcHelper->AddProperty(&szName,AI_MATKEY_NAME);

            sharedData.abNeedMaterials.resize(1,false);
        }

        // now get a pointer to all texture coords in the group
        groupInfo.pcGroupUVs = (BE_NCONST MDL::TexCoord_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->num_stpts; ++i){
            AI_SWAP4(groupInfo.pcGroupUVs[i].u);
            AI_SWAP4(groupInfo.pcGroupUVs[i].v);
        }
        szCurrent += pcHeader->skinpoint_stc_size * groupInfo.pcGroup->num_stpts;

        // now get a pointer to all triangle in the group
        groupInfo.pcGroupTris = (Triangle_MDL7*)szCurrent;
        szCurrent += pcHeader->triangle_stc_size * groupInfo.pcGroup->numtris;

        // now get a pointer to all vertices in the group
        groupInfo.pcGroupVerts = (BE_NCONST MDL::Vertex_MDL7*)szCurrent;
        for(int i = 0; i < groupInfo.pcGroup->numverts; ++i){
            AI_SWAP4(groupInfo.pcGroupVerts[i].x);
            AI_SWAP4(groupInfo.pcGroupVerts[i].y);
            AI_SWAP4(groupInfo.pcGroupVerts[i].z);

            AI_SWAP2(groupInfo.pcGroupVerts[i].vertindex);
            //We can not swap the normal information now as we don't know which of the two kinds it is
        }
        szCurrent += pcHeader->mainvertex_stc_size * groupInfo.pcGroup->numverts;
        VALIDATE_FILE_SIZE(szCurrent);

        MDL::IntSplitGroupData_MDL7 splitGroupData(sharedData,avOutList[iGroup]);
        MDL::IntGroupData_MDL7 groupData;
        if (groupInfo.pcGroup->numtris && groupInfo.pcGroup->numverts)
        {
            // build output vectors
            const unsigned int iNumVertices = groupInfo.pcGroup->numtris*3;
            groupData.vPositions.resize(iNumVertices);
            groupData.vNormals.resize(iNumVertices);

            if (sharedData.apcOutBones)groupData.aiBones.resize(iNumVertices,UINT_MAX);

            // it is also possible that there are 0 UV coordinate sets
            if (groupInfo.pcGroup->num_stpts){
                groupData.vTextureCoords1.resize(iNumVertices,aiVector3D());

                // check whether the triangle data structure is large enough
                // to contain a second UV coordinate set
                if (pcHeader->triangle_stc_size >= AI_MDL7_TRIANGLE_STD_SIZE_TWO_UV)    {
                    groupData.vTextureCoords2.resize(iNumVertices,aiVector3D());
                    groupData.bNeed2UV = true;
                }
            }
            groupData.pcFaces.resize(groupInfo.pcGroup->numtris);

            // read all faces into the preallocated arrays
            ReadFaces_3DGS_MDL7(groupInfo, groupData);

            // sort by materials
            SortByMaterials_3DGS_MDL7(groupInfo, groupData,
                splitGroupData);

            for (unsigned int qq = 0; qq < sharedData.pcMats.size();++qq)   {
                if (!splitGroupData.aiSplit[qq]->empty())
                    sharedData.abNeedMaterials[qq] = true;
            }
        }
        else ASSIMP_LOG_WARN("[3DGS MDL7] Mesh group consists of 0 "
            "vertices or faces. It will be skipped.");

        // process all frames and generate output meshes
        ProcessFrames_3DGS_MDL7(groupInfo,groupData, sharedData,szCurrent,&szCurrent);
        GenerateOutputMeshes_3DGS_MDL7(groupData,splitGroupData);
    }

    // generate a nodegraph and subnodes for each group
    pScene->mRootNode = new aiNode();

    // now we need to build a final mesh list
    for (uint32_t i = 0; i < pcHeader->groups_num;++i)
        pScene->mNumMeshes += (unsigned int)avOutList[i].size();

    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];  {
        unsigned int p = 0,q = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            for (unsigned int a = 0; a < avOutList[i].size();++a)   {
                pScene->mMeshes[p++] = avOutList[i][a];
            }
            if (!avOutList[i].empty())++pScene->mRootNode->mNumChildren;
        }
        // we will later need an extra node to serve as parent for all bones
        if (sharedData.apcOutBones)++pScene->mRootNode->mNumChildren;
        this->pScene->mRootNode->mChildren = new aiNode*[pScene->mRootNode->mNumChildren];
        p = 0;
        for (uint32_t i = 0; i < pcHeader->groups_num;++i)  {
            if (avOutList[i].empty())continue;

            aiNode* const pcNode = pScene->mRootNode->mChildren[p] = new aiNode();
            pcNode->mNumMeshes = (unsigned int)avOutList[i].size();
            pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];
            pcNode->mParent = this->pScene->mRootNode;
            for (unsigned int a = 0; a < pcNode->mNumMeshes;++a)
                pcNode->mMeshes[a] = q + a;
            q += (unsigned int)avOutList[i].size();

            // setup the name of the node
            char* const szBuffer = &aszGroupNameBuffer[i*AI_MDL7_MAX_GROUPNAMESIZE];
			if ('\0' == *szBuffer) {
				const size_t maxSize(buffersize - (i*AI_MDL7_MAX_GROUPNAMESIZE));
				pcNode->mName.length = ai_snprintf(szBuffer, maxSize, "Group_%u", p);
			} else {
				pcNode->mName.length = ::strlen(szBuffer);
			}
            ::strncpy(pcNode->mName.data,szBuffer,MAXLEN-1);
            ++p;
        }
    }

    // if there is only one root node with a single child we can optimize it a bit ...
    if (1 == pScene->mRootNode->mNumChildren && !sharedData.apcOutBones)    {
        aiNode* pcOldRoot = this->pScene->mRootNode;
        pScene->mRootNode = pcOldRoot->mChildren[0];
        pcOldRoot->mChildren[0] = NULL;
        delete pcOldRoot;
        pScene->mRootNode->mParent = NULL;
    }
    else pScene->mRootNode->mName.Set("<mesh_root>");

    delete[] avOutList;
    delete[] aszGroupNameBuffer;
    AI_DEBUG_INVALIDATE_PTR(avOutList);
    AI_DEBUG_INVALIDATE_PTR(aszGroupNameBuffer);

    // build a final material list.
    CopyMaterials_3DGS_MDL7(sharedData);
    HandleMaterialReferences_3DGS_MDL7();

    // generate output bone animations and add all bones to the scenegraph
    if (sharedData.apcOutBones) {
        // this step adds empty dummy bones to the nodegraph
        // insert another dummy node to avoid name conflicts
        aiNode* const pc = pScene->mRootNode->mChildren[pScene->mRootNode->mNumChildren-1] = new aiNode();

        pc->mName.Set("<skeleton_root>");

        // add bones to the nodegraph
        AddBonesToNodeGraph_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones,pc,0xffff);

        // this steps build a valid output animation
        BuildOutputAnims_3DGS_MDL7((const Assimp::MDL::IntBone_MDL7 **)
            sharedData.apcOutBones);
    }
}